

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_peer_dispatch_incoming_reliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetList *pEVar1;
  ushort uVar2;
  enet_uint16 eVar3;
  ushort uVar4;
  _ENetListNode *p_Var5;
  _ENetListNode *p_Var6;
  _ENetHost *p_Var7;
  ushort uVar8;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var9;
  ENetListIterator first;
  ENetIncomingCommand *startCommand;
  ENetIncomingCommand *excludeCommand;
  ENetIncomingCommand *pEVar10;
  int iVar11;
  ushort uVar12;
  bool bVar13;
  
  for (p_Var9 = (channel->incomingReliableCommands).sentinel.next;
      ((p_Var9 != &(channel->incomingReliableCommands).sentinel &&
       (*(int *)&p_Var9[4].previous == 0)) &&
      (eVar3 = *(enet_uint16 *)&p_Var9[1].next,
      eVar3 == (enet_uint16)(channel->incomingReliableSequenceNumber + 1))); p_Var9 = p_Var9->next)
  {
    channel->incomingReliableSequenceNumber = eVar3;
    iVar11 = *(int *)((long)&p_Var9[4].next + 4);
    if (iVar11 != 0) {
      channel->incomingReliableSequenceNumber = (eVar3 + (short)iVar11) - 1;
    }
  }
  p_Var5 = (channel->incomingReliableCommands).sentinel.next;
  if (p_Var9 != p_Var5) {
    channel->incomingUnreliableSequenceNumber = 0;
    p_Var9 = p_Var9->previous;
    p_Var6 = p_Var5->previous;
    p_Var6->next = p_Var9->next;
    p_Var9->next->previous = p_Var6;
    p_Var6 = (peer->dispatchedCommands).sentinel.previous;
    p_Var5->previous = p_Var6;
    p_Var9->next = &(peer->dispatchedCommands).sentinel;
    p_Var6->next = p_Var5;
    (peer->dispatchedCommands).sentinel.previous = p_Var9;
    uVar4 = peer->flags;
    if ((uVar4 & 1) == 0) {
      p_Var7 = peer->host;
      p_Var9 = (p_Var7->dispatchQueue).sentinel.previous;
      (peer->dispatchList).previous = p_Var9;
      (peer->dispatchList).next = &(p_Var7->dispatchQueue).sentinel;
      p_Var9->next = &peer->dispatchList;
      (p_Var7->dispatchQueue).sentinel.previous = &peer->dispatchList;
      peer->flags = uVar4 | 1;
    }
    if ((channel->incomingUnreliableCommands).sentinel.next !=
        &(channel->incomingUnreliableCommands).sentinel) {
      pEVar1 = &channel->incomingUnreliableCommands;
      startCommand = (ENetIncomingCommand *)(channel->incomingUnreliableCommands).sentinel.next;
      excludeCommand = startCommand;
      pEVar10 = startCommand;
      if (startCommand != (ENetIncomingCommand *)pEVar1) {
        do {
          iVar11 = 4;
          if (((excludeCommand->command).header.command & 0xf) != 9) {
            uVar4 = excludeCommand->reliableSequenceNumber;
            uVar2 = channel->incomingReliableSequenceNumber;
            if (uVar4 == uVar2) {
              if (excludeCommand->fragmentsRemaining == 0) {
                channel->incomingUnreliableSequenceNumber = excludeCommand->unreliableSequenceNumber
                ;
              }
              else {
                if (pEVar10 == excludeCommand) {
                  if (startCommand != excludeCommand) {
                    startCommand = (ENetIncomingCommand *)
                                   (excludeCommand->incomingCommandList).previous;
                  }
                }
                else {
                  p_Var9 = (excludeCommand->incomingCommandList).previous;
                  p_Var5 = (pEVar10->incomingCommandList).previous;
                  p_Var5->next = p_Var9->next;
                  p_Var9->next->previous = p_Var5;
                  p_Var5 = (peer->dispatchedCommands).sentinel.previous;
                  (pEVar10->incomingCommandList).previous = p_Var5;
                  p_Var9->next = &(peer->dispatchedCommands).sentinel;
                  p_Var5->next = &pEVar10->incomingCommandList;
                  (peer->dispatchedCommands).sentinel.previous = p_Var9;
                  uVar4 = peer->flags;
                  startCommand = excludeCommand;
                  if ((uVar4 & 1) == 0) {
                    p_Var7 = peer->host;
                    p_Var9 = (p_Var7->dispatchQueue).sentinel.previous;
                    (peer->dispatchList).previous = p_Var9;
                    (peer->dispatchList).next = &(p_Var7->dispatchQueue).sentinel;
                    p_Var9->next = &peer->dispatchList;
                    (p_Var7->dispatchQueue).sentinel.previous = &peer->dispatchList;
                    peer->flags = uVar4 | 1;
                  }
                }
LAB_00105a20:
                pEVar10 = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next;
                iVar11 = 0;
              }
            }
            else {
              uVar8 = uVar2 >> 0xc;
              uVar12 = (uVar4 >> 0xc) + 0x10;
              if (uVar2 <= uVar4) {
                uVar12 = uVar4 >> 0xc;
              }
              bVar13 = (ushort)(uVar8 + 7) <= uVar12;
              iVar11 = 2;
              if (bVar13 || uVar12 < uVar8) {
                startCommand = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next;
                iVar11 = 0;
                if (pEVar10 != excludeCommand) {
                  p_Var9 = (excludeCommand->incomingCommandList).previous;
                  p_Var5 = (pEVar10->incomingCommandList).previous;
                  p_Var5->next = p_Var9->next;
                  p_Var9->next->previous = p_Var5;
                  p_Var5 = (peer->dispatchedCommands).sentinel.previous;
                  (pEVar10->incomingCommandList).previous = p_Var5;
                  p_Var9->next = &(peer->dispatchedCommands).sentinel;
                  p_Var5->next = &pEVar10->incomingCommandList;
                  (peer->dispatchedCommands).sentinel.previous = p_Var9;
                  uVar4 = peer->flags;
                  if ((uVar4 & 1) == 0) {
                    p_Var7 = peer->host;
                    p_Var9 = (p_Var7->dispatchQueue).sentinel.previous;
                    (peer->dispatchList).previous = p_Var9;
                    (peer->dispatchList).next = &(p_Var7->dispatchQueue).sentinel;
                    p_Var9->next = &peer->dispatchList;
                    (p_Var7->dispatchQueue).sentinel.previous = &peer->dispatchList;
                    peer->flags = uVar4 | 1;
                  }
                }
              }
              if (bVar13 || uVar12 < uVar8) goto LAB_00105a20;
            }
          }
        } while ((iVar11 != 2) &&
                (excludeCommand = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next,
                excludeCommand != (ENetIncomingCommand *)pEVar1));
      }
      if (pEVar10 != excludeCommand) {
        p_Var9 = (excludeCommand->incomingCommandList).previous;
        p_Var5 = (pEVar10->incomingCommandList).previous;
        p_Var5->next = p_Var9->next;
        p_Var9->next->previous = p_Var5;
        p_Var5 = (peer->dispatchedCommands).sentinel.previous;
        (pEVar10->incomingCommandList).previous = p_Var5;
        p_Var9->next = &(peer->dispatchedCommands).sentinel;
        p_Var5->next = &pEVar10->incomingCommandList;
        (peer->dispatchedCommands).sentinel.previous = p_Var9;
        uVar4 = peer->flags;
        startCommand = excludeCommand;
        if ((uVar4 & 1) == 0) {
          p_Var7 = peer->host;
          p_Var9 = (p_Var7->dispatchQueue).sentinel.previous;
          (peer->dispatchList).previous = p_Var9;
          (peer->dispatchList).next = &(p_Var7->dispatchQueue).sentinel;
          p_Var9->next = &peer->dispatchList;
          (p_Var7->dispatchQueue).sentinel.previous = &peer->dispatchList;
          peer->flags = uVar4 | 1;
        }
      }
      enet_peer_remove_incoming_commands
                (peer,(ENetList *)(pEVar1->sentinel).next,&startCommand->incomingCommandList,
                 &queuedCommand->incomingCommandList,excludeCommand);
      return;
    }
  }
  return;
}

Assistant:

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer *peer, ENetChannel *channel, ENetIncomingCommand *queuedCommand) {
        ENetListIterator currentCommand;

        for (currentCommand = enet_list_begin(&channel->incomingReliableCommands);
            currentCommand != enet_list_end(&channel->incomingReliableCommands);
            currentCommand = enet_list_next(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (incomingCommand->fragmentsRemaining > 0 || incomingCommand->reliableSequenceNumber != (enet_uint16) (channel->incomingReliableSequenceNumber + 1)) {
                break;
            }

            channel->incomingReliableSequenceNumber = incomingCommand->reliableSequenceNumber;

            if (incomingCommand->fragmentCount > 0) {
                channel->incomingReliableSequenceNumber += incomingCommand->fragmentCount - 1;
            }
        }

        if (currentCommand == enet_list_begin(&channel->incomingReliableCommands)) {
            return;
        }

        channel->incomingUnreliableSequenceNumber = 0;
        enet_list_move(enet_list_end(&peer->dispatchedCommands), enet_list_begin(&channel->incomingReliableCommands), enet_list_previous(currentCommand));

        if (!(peer->flags & ENET_PEER_FLAG_NEEDS_DISPATCH)) {
            enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);
            peer->flags |= ENET_PEER_FLAG_NEEDS_DISPATCH;
        }

        if (!enet_list_empty(&channel->incomingUnreliableCommands)) {
            enet_peer_dispatch_incoming_unreliable_commands(peer, channel, queuedCommand);
        }
    }